

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::BlendA64MaskTest8B_d16_DISABLED_Speed_Test::
~BlendA64MaskTest8B_d16_DISABLED_Speed_Test(BlendA64MaskTest8B_d16_DISABLED_Speed_Test *this)

{
  BlendA64MaskTest8B_d16_DISABLED_Speed_Test *in_stack_00000010;
  
  anon_unknown.dwarf_105c52d::BlendA64MaskTest8B_d16_DISABLED_Speed_Test::
  ~BlendA64MaskTest8B_d16_DISABLED_Speed_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, DISABLED_Speed) {
  const int kRunTimes = 10000000;
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand16() & kSrcMaxBitsMask;
      src1_[i] = rng_.Rand16() & kSrcMaxBitsMask;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, kRunTimes);
  }
}